

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_patch.c
# Opt level: O2

int json_patch_apply(json_object *copy_from,json_object *patch,json_object **base,
                    json_patch_error *patch_error)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  size_t sVar5;
  json_object *jso;
  char *path;
  json_patch_error *patch_error_00;
  ulong idx;
  json_patch_error *pjVar6;
  json_object *jpath;
  json_object *jop;
  json_object *local_70;
  json_object *value1;
  json_patch_error placeholder;
  
  patch_error_00 = patch_error;
  if (patch_error == (json_patch_error *)0x0) {
    patch_error_00 = &placeholder;
  }
  patch_error_00->patch_failure_idx = 0xffffffffffffffff;
  patch_error_00->errno_code = 0;
  pjVar6 = &placeholder;
  if (((base == (json_object **)0x0) ||
      (copy_from == (json_object *)0x0 && *base == (json_object *)0x0)) ||
     (copy_from != (json_object *)0x0 && *base != (json_object *)0x0)) {
    patch_error_00->errno_code = 0xe;
    if (patch_error != (json_patch_error *)0x0) {
      pjVar6 = patch_error;
    }
    pcVar3 = "Exactly one of *base or copy_from must be non-NULL";
  }
  else {
    iVar1 = json_object_is_type(patch,json_type_array);
    if (iVar1 == 0) {
      patch_error_00->errno_code = 0xe;
      if (patch_error != (json_patch_error *)0x0) {
        pjVar6 = patch_error;
      }
      pcVar3 = "Patch object is not of type json_type_array";
    }
    else if ((copy_from == (json_object *)0x0) ||
            (iVar1 = json_object_deep_copy(copy_from,base,(json_c_shallow_copy_fn *)0x0), -1 < iVar1
            )) {
      if (patch_error != (json_patch_error *)0x0) {
        pjVar6 = patch_error;
      }
      iVar1 = 0;
      idx = 0;
      while( true ) {
        sVar5 = json_object_array_length(patch);
        if (sVar5 <= idx) {
          return iVar1;
        }
        jso = json_object_array_get_idx(patch,idx);
        patch_error_00->patch_failure_idx = idx;
        iVar1 = json_object_object_get_ex(jso,"op",&jop);
        if (iVar1 == 0) break;
        pcVar3 = json_object_get_string(jop);
        iVar1 = json_object_object_get_ex(jso,"path",&jpath);
        if (iVar1 == 0) {
          pcVar3 = "Patch object does not contain \'path\' field";
          goto LAB_00109e76;
        }
        path = json_object_get_string(jpath);
        iVar1 = strcmp(pcVar3,"test");
        if (iVar1 == 0) {
          iVar1 = json_object_object_get_ex(jso,"value",&value1);
          if (iVar1 == 0) {
            patch_error_00->errno_code = 0x16;
            pcVar3 = "Patch object does not contain a \'value\' field";
          }
          else {
            iVar1 = json_pointer_get(*base,path,&local_70);
            if (iVar1 != 0) goto LAB_00109d66;
            iVar2 = json_object_equal(value1,local_70);
            iVar1 = 0;
            if (iVar2 != 0) goto LAB_00109e23;
            patch_error_00->errno_code = 2;
            pcVar3 = "Value of element referenced by \'path\' field did not match \'value\' field";
          }
          pjVar6->errmsg = pcVar3;
          piVar4 = __errno_location();
LAB_00109db0:
          *piVar4 = 0;
          iVar1 = -1;
        }
        else {
          iVar1 = strcmp(pcVar3,"remove");
          if (iVar1 == 0) {
            iVar1 = json_pointer_get_internal(*base,path,(json_pointer_get_result *)&value1);
            if (iVar1 != 0) {
LAB_00109d66:
              piVar4 = __errno_location();
              iVar1 = *piVar4;
              patch_error_00->errno_code = iVar1;
              pcVar3 = "Invalid path field";
              if (iVar1 == 2) {
                pcVar3 = "Did not find element referenced by path field";
              }
              pjVar6->errmsg = pcVar3;
              goto LAB_00109db0;
            }
            iVar1 = __json_patch_apply_remove((json_pointer_get_result *)&value1);
            if (iVar1 < 0) {
              patch_error_00->errno_code = 0x16;
              pjVar6->errmsg = "Unable to remove path referenced by \'path\' field";
              piVar4 = __errno_location();
              *piVar4 = 0;
            }
            if (value1 == (json_object *)0x0) {
              *base = (json_object *)0x0;
            }
          }
          else {
            iVar1 = strcmp(pcVar3,"add");
            if (iVar1 == 0) {
              iVar1 = 1;
            }
            else {
              iVar1 = strcmp(pcVar3,"replace");
              if (iVar1 != 0) {
                iVar1 = strcmp(pcVar3,"move");
                if (iVar1 == 0) {
                  iVar1 = 1;
                }
                else {
                  iVar1 = strcmp(pcVar3,"copy");
                  if (iVar1 != 0) {
                    pcVar3 = "Patch object has invalid \'op\' field";
                    goto LAB_00109e76;
                  }
                  iVar1 = 0;
                }
                iVar1 = json_patch_apply_move_copy(base,jso,path,iVar1,patch_error_00);
                goto LAB_00109e23;
              }
              iVar1 = 0;
            }
            iVar1 = json_patch_apply_add_replace(base,jso,path,iVar1,patch_error_00);
          }
        }
LAB_00109e23:
        if (iVar1 < 0) {
          return iVar1;
        }
        idx = idx + 1;
      }
      pcVar3 = "Patch object does not contain \'op\' field";
LAB_00109e76:
      patch_error_00->errno_code = 0x16;
    }
    else {
      patch_error_00->errno_code = 0xc;
      if (patch_error != (json_patch_error *)0x0) {
        pjVar6 = patch_error;
      }
      pcVar3 = "Unable to copy copy_from using json_object_deep_copy()";
    }
  }
  pjVar6->errmsg = pcVar3;
  piVar4 = __errno_location();
  *piVar4 = 0;
  return -1;
}

Assistant:

int json_patch_apply(struct json_object *copy_from, struct json_object *patch,
                     struct json_object **base, struct json_patch_error *patch_error)
{
	size_t ii;
	int rc = 0;
	struct json_patch_error placeholder;

	if (!patch_error)
		patch_error = &placeholder;

	patch_error->patch_failure_idx = SIZE_T_MAX;
	patch_error->errno_code = 0;

	if (base == NULL|| 
	    (*base == NULL && copy_from == NULL) ||
	    (*base != NULL && copy_from != NULL))
	{
		_set_err(EFAULT, "Exactly one of *base or copy_from must be non-NULL");
		return -1;
	}
	    
	if (!json_object_is_type(patch, json_type_array)) {
		_set_err(EFAULT, "Patch object is not of type json_type_array");
		return -1;
	}

	if (copy_from != NULL)
	{
		if (json_object_deep_copy(copy_from, base, NULL) < 0)
		{
			_set_err(ENOMEM, "Unable to copy copy_from using json_object_deep_copy()");
			return -1;
		}
	}

	/* Go through all operations ; apply them on res */
	for (ii = 0; ii < json_object_array_length(patch); ii++) {
		struct json_object *jop, *jpath;
		struct json_object *patch_elem = json_object_array_get_idx(patch, ii);
		const char *op, *path;

		patch_error->patch_failure_idx = ii;

		if (!json_object_object_get_ex(patch_elem, "op", &jop)) {
			_set_err(EINVAL, "Patch object does not contain 'op' field");
			return -1;
		}
		op = json_object_get_string(jop);
		if (!json_object_object_get_ex(patch_elem, "path", &jpath)) {
			_set_err(EINVAL, "Patch object does not contain 'path' field");
			return -1;
		}
		path = json_object_get_string(jpath); // Note: empty string is ok!

		if (!strcmp(op, "test"))
			rc = json_patch_apply_test(base, patch_elem, path, patch_error);
		else if (!strcmp(op, "remove"))
			rc = json_patch_apply_remove(base, path, patch_error);
		else if (!strcmp(op, "add"))
			rc = json_patch_apply_add_replace(base, patch_elem, path, 1, patch_error);
		else if (!strcmp(op, "replace"))
			rc = json_patch_apply_add_replace(base, patch_elem, path, 0, patch_error);
		else if (!strcmp(op, "move"))
			rc = json_patch_apply_move_copy(base, patch_elem, path, 1, patch_error);
		else if (!strcmp(op, "copy"))
			rc = json_patch_apply_move_copy(base, patch_elem, path, 0, patch_error);
		else {
			_set_err(EINVAL, "Patch object has invalid 'op' field");
			return -1;
		}
		if (rc < 0)
			break;
	}

	return rc;
}